

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

string * __thiscall Graph::to_string_abi_cxx11_(string *__return_storage_ptr__,Graph *this)

{
  pointer this_00;
  pointer this_01;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"digraph G { \n",(allocator<char> *)&local_50);
  for (this_00 = (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_start;
      this_00 !=
      (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
      _M_finish; this_00 = this_00 + 1) {
    Node::to_string_abi_cxx11_(&local_70,this_00);
    std::operator+(&local_50,&local_70,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  for (this_01 = (this->connections).super__Vector_base<Connection,_std::allocator<Connection>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      this_01 !=
      (this->connections).super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
      super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
    Connection::to_string_abi_cxx11_(&local_70,this_01);
    std::operator+(&local_50,&local_70,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((this->rankdir)._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&this->rankdir);
  }
  std::operator+(&local_70,"rankdir=",&this->rankdir);
  std::operator+(&local_50,&local_70,"\n}");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

string Graph::to_string() {
    string str = "digraph G { \n";
    for (vector<Node>::iterator node = nodes.begin(); node != nodes.end(); ++node) {
        str += node->to_string() + "\n";
    }
    for (vector<Connection>::iterator connection = connections.begin(); connection != connections.end(); ++connection) {
        str += connection->to_string() + "\n";
    }
    if (rankdir.empty()) {
        rankdir = "LR";
    }
    str += "rankdir=" + rankdir + "\n}";
    return str;
}